

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTranslate.cpp
# Opt level: O0

void TranslateVariableAccess(ExpressionTranslateContext *ctx,ExprVariableAccess *expression)

{
  ExprVariableAccess *expression_local;
  ExpressionTranslateContext *ctx_local;
  
  if (expression->variable->type == ctx->ctx->typeVoid) {
    Print(ctx,"void()");
  }
  else {
    if (expression->variable->scope == ctx->ctx->globalScope) {
      Print(ctx,"::");
    }
    TranslateVariableName(ctx,expression->variable);
  }
  return;
}

Assistant:

void TranslateVariableAccess(ExpressionTranslateContext &ctx, ExprVariableAccess *expression)
{
	if(expression->variable->type == ctx.ctx.typeVoid)
	{
		Print(ctx, "void()");
		return;
	}

	if(expression->variable->scope == ctx.ctx.globalScope)
		Print(ctx, "::");

	TranslateVariableName(ctx, expression->variable);
}